

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void ExpFmt(GmfMshSct *msh,int KwdCod)

{
  char cVar1;
  int iVar2;
  char *__s1;
  int *piVar3;
  size_t sVar4;
  int iVar5;
  int in_ESI;
  int *in_RDI;
  KwdSct *kwd;
  char *InpFmt;
  char chr;
  int FltWrd;
  int IntWrd;
  int TmpSiz;
  int j;
  int i;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  
  local_18 = 0;
  __s1 = GmfKwdFmt[in_ESI][2];
  piVar3 = in_RDI + (long)in_ESI * 0xcc0 + 0x44;
  sVar4 = strlen(GmfKwdFmt[in_ESI][1]);
  if (sVar4 == 0) {
    *piVar3 = 1;
  }
  else {
    iVar5 = strcmp(__s1,"sr");
    if ((iVar5 == 0) || (iVar5 = strcmp(__s1,"hr"), iVar5 == 0)) {
      *piVar3 = 3;
    }
    else {
      *piVar3 = 2;
    }
  }
  if (*piVar3 == 3) {
    for (local_10 = 0; local_10 < piVar3[5]; local_10 = local_10 + 1) {
      switch(piVar3[(long)local_10 + 6]) {
      case 1:
        local_18 = local_18 + 1;
        break;
      case 2:
        local_18 = *in_RDI + local_18;
        break;
      case 3:
        local_18 = (*in_RDI * (*in_RDI + 1)) / 2 + local_18;
        break;
      case 4:
        local_18 = *in_RDI * *in_RDI + local_18;
      }
    }
  }
  piVar3[4] = 0;
  piVar3[3] = 0;
  local_10 = 0;
  while (sVar4 = strlen(__s1), local_10 < (int)sVar4) {
    iVar5 = local_10 + 1;
    cVar1 = __s1[local_10];
    if (cVar1 == 'd') {
      local_10 = local_10 + 2;
      cVar1 = __s1[iVar5];
      for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
        iVar5 = piVar3[3];
        piVar3[3] = iVar5 + 1;
        *(char *)((long)piVar3 + (long)iVar5 + 0xfd8) = cVar1;
      }
    }
    else if ((cVar1 == 's') || (cVar1 == 'h')) {
      local_10 = local_10 + 2;
      cVar1 = __s1[iVar5];
      for (local_14 = 0; local_14 < local_18; local_14 = local_14 + 1) {
        iVar5 = piVar3[3];
        piVar3[3] = iVar5 + 1;
        *(char *)((long)piVar3 + (long)iVar5 + 0xfd8) = cVar1;
      }
    }
    else {
      iVar2 = piVar3[3];
      piVar3[3] = iVar2 + 1;
      *(char *)((long)piVar3 + (long)iVar2 + 0xfd8) = cVar1;
      local_10 = iVar5;
    }
  }
  if (in_RDI[6] == 0x20) {
    local_20 = 1;
  }
  else {
    local_20 = 2;
  }
  if (in_RDI[1] < 4) {
    local_1c = 1;
  }
  else {
    local_1c = 2;
  }
  for (local_10 = 0; local_10 < piVar3[3]; local_10 = local_10 + 1) {
    cVar1 = *(char *)((long)piVar3 + (long)local_10 + 0xfd8);
    if (cVar1 == 'c') {
      piVar3[4] = piVar3[4] + 0x40;
    }
    else if (cVar1 == 'i') {
      piVar3[4] = local_1c + piVar3[4];
    }
    else if (cVar1 == 'r') {
      piVar3[4] = local_20 + piVar3[4];
    }
  }
  iVar5 = strcmp(__s1,"hr");
  if ((iVar5 == 0) && (1 < piVar3[2])) {
    for (local_10 = 1; local_10 <= piVar3[2]; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < piVar3[3]; local_14 = local_14 + 1) {
        *(undefined1 *)((long)piVar3 + (long)(local_10 * piVar3[3] + local_14) + 0xfd8) =
             *(undefined1 *)((long)piVar3 + (long)local_14 + 0xfd8);
      }
    }
    piVar3[3] = piVar3[2] * piVar3[3];
    piVar3[4] = piVar3[2] * piVar3[4];
  }
  for (local_10 = 0; local_10 < piVar3[3]; local_10 = local_10 + 1) {
    if (*(char *)((long)piVar3 + (long)local_10 + 0xfd8) == 'i') {
      piVar3[0x3f0] = piVar3[0x3f0] + 1;
    }
    else if (*(char *)((long)piVar3 + (long)local_10 + 0xfd8) == 'r') {
      piVar3[0x3f1] = piVar3[0x3f1] + 1;
    }
  }
  return;
}

Assistant:

static void ExpFmt(GmfMshSct *msh, int KwdCod)
{
   int         i, j, TmpSiz=0, IntWrd, FltWrd;
   char        chr;
   const char  *InpFmt = GmfKwdFmt[ KwdCod ][2];
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];

   // Set the kwd's type
   if(!strlen(GmfKwdFmt[ KwdCod ][1]))
      kwd->typ = InfKwd;
   else if( !strcmp(InpFmt, "sr") || !strcmp(InpFmt, "hr") )
      kwd->typ = SolKwd;
   else
      kwd->typ = RegKwd;

   // Get the solution-field's size
   if(kwd->typ == SolKwd)
      for(i=0;i<kwd->NmbTyp;i++)
         switch(kwd->TypTab[i])
         {
            case GmfSca    : TmpSiz += 1; break;
            case GmfVec    : TmpSiz += msh->dim; break;
            case GmfSymMat : TmpSiz += (msh->dim * (msh->dim+1)) / 2; break;
            case GmfMat    : TmpSiz += msh->dim * msh->dim; break;
         }

   // Scan each character from the format string
   i = kwd->SolSiz = kwd->NmbWrd = 0;

   while(i < (int)strlen(InpFmt))
   {
      chr = InpFmt[ i++ ];

      if(chr == 'd')
      {
         chr = InpFmt[i++];

         for(j=0;j<msh->dim;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else if((chr == 's')||(chr == 'h'))
      {
         chr = InpFmt[i++];

         for(j=0;j<TmpSiz;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else
         kwd->fmt[ kwd->SolSiz++ ] = chr;
   }

   if(msh->FltSiz == 32)
      FltWrd = 1;
   else
      FltWrd = 2;

   if(msh->ver <= 3)
      IntWrd = 1;
   else
      IntWrd = 2;

   for(i=0;i<kwd->SolSiz;i++)
      switch(kwd->fmt[i])
      {
         case 'i' : kwd->NmbWrd += IntWrd; break;
         case 'c' : kwd->NmbWrd += FilStrSiz; break;
         case 'r' : kwd->NmbWrd += FltWrd;break;
      }

   // HO solution: duplicate the format as many times as the number of nodes
   if( !strcmp(InpFmt, "hr") && (kwd->NmbNod > 1) )
   {
      for(i=1;i<=kwd->NmbNod;i++)
         for(j=0;j<kwd->SolSiz;j++)
            kwd->fmt[ i * kwd->SolSiz + j ] = kwd->fmt[j];

      kwd->SolSiz *= kwd->NmbNod;
      kwd->NmbWrd *= kwd->NmbNod;
   }

   // Count the final number of intergers and reals needed by the Fortran API
   for(i=0;i<kwd->SolSiz;i++)
      if(kwd->fmt[i] == 'i')
         kwd->NmbInt++;
      else if(kwd->fmt[i] == 'r')
         kwd->NmbDbl++;
}